

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::BitAndOperation>
               (uhugeint_t *idata,AggregateInputData *aggr_input_data,
               BitState<duckdb::uhugeint_t> *state,idx_t count,ValidityMask *mask,
               SelectionVector *sel_vector)

{
  sel_t *psVar1;
  bool bVar2;
  AggregateUnaryInput *pAVar3;
  idx_t i;
  idx_t iVar4;
  uhugeint_t local_48;
  idx_t local_38;
  
  psVar1 = sel_vector->sel_vector;
  local_48.lower = (uint64_t)aggr_input_data;
  local_48.upper = (uint64_t)mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    pAVar3 = (AggregateUnaryInput *)count;
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      local_38 = iVar4;
      if (psVar1 != (sel_t *)0x0) {
        local_38 = (idx_t)psVar1[iVar4];
      }
      BitwiseOperation::
      Operation<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitAndOperation>
                ((BitwiseOperation *)state,(BitState<duckdb::uhugeint_t> *)(idata + local_38),
                 &local_48,pAVar3);
    }
  }
  else {
    pAVar3 = (AggregateUnaryInput *)count;
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      local_38 = iVar4;
      if (psVar1 != (sel_t *)0x0) {
        local_38 = (idx_t)psVar1[iVar4];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,local_38);
      if (bVar2) {
        BitwiseOperation::
        Operation<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitAndOperation>
                  ((BitwiseOperation *)state,(BitState<duckdb::uhugeint_t> *)(idata + local_38),
                   &local_48,pAVar3);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}